

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::
validateNeuralNetwork<CoreML::Specification::NeuralNetworkRegressor>
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkRegressor *nn)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32 uVar4;
  uint32 uVar5;
  LayerCase LVar6;
  string *psVar7;
  RepeatedPtrField<CoreML::Specification::Tensor> *pRVar8;
  uint32 *puVar9;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar10;
  reference p_Var11;
  reference p_Var12;
  mapped_type *pmVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  undefined1 local_630 [8];
  string err_7;
  string layer_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  const_iterator __end0_4;
  const_iterator __begin0_4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  undefined1 local_518 [8];
  string err_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  const_iterator __end0_3;
  const_iterator __begin0_3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  undefined1 local_460 [8];
  string err_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  string err_4;
  Result local_340;
  Tensor *tensor_1;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  RepeatedPtrField<CoreML::Specification::Tensor> *__range4_1;
  undefined1 local_2f0 [4];
  int idx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  string err_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [8];
  string err_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string err_1;
  Result local_130;
  Tensor *tensor;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  RepeatedPtrField<CoreML::Specification::Tensor> *__range4;
  undefined1 local_e0 [4];
  int idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string err;
  NeuralNetworkLayer *layer;
  const_iterator __end0;
  RepeatedPtrIterator<const_CoreML::Specification::NeuralNetworkLayer> local_58;
  const_iterator __begin0;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *__range1;
  Result r;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.super__Rb_tree_node_base._M_right = (_Base_ptr)nn;
  r.m_message._M_storage._M_storage = (uchar  [8])this;
  Result::Result((Result *)&__range1);
  __begin0.it_ = (void **)Specification::NeuralNetworkRegressor::layers
                                    ((NeuralNetworkRegressor *)
                                     r.m_message.super__Rb_tree_node_base._M_right);
  local_58.it_ = (void **)google::protobuf::
                          RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::begin
                                    ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                                     __begin0.it_);
  layer = (NeuralNetworkLayer *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::end
                    ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)__begin0.it_);
  do {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::NeuralNetworkLayer>::operator!=
                      (&local_58,(iterator *)&layer);
    if (!bVar1) {
      Result::Result(__return_storage_ptr__);
      err.super__Rb_tree_node_base._M_right._4_4_ = 1;
LAB_0038fdb5:
      Result::~Result((Result *)&__range1);
      return __return_storage_ptr__;
    }
    err._M_storage._M_storage =
         (uchar  [8])
         google::protobuf::internal::
         RepeatedPtrIterator<const_CoreML::Specification::NeuralNetworkLayer>::operator*(&local_58);
    bVar1 = Result::good((Result *)&__range1);
    if (!bVar1) {
      Result::Result(__return_storage_ptr__,(Result *)&__range1);
      err.super__Rb_tree_node_base._M_right._4_4_ = 1;
      goto LAB_0038fdb5;
    }
    if ((this->ndArrayInterpretation & 1U) != 0) {
      iVar2 = Specification::NeuralNetworkLayer::inputtensor_size
                        ((NeuralNetworkLayer *)err._M_storage._M_storage);
      if (iVar2 != 0) {
        iVar2 = Specification::NeuralNetworkLayer::input_size
                          ((NeuralNetworkLayer *)err._M_storage._M_storage);
        iVar3 = Specification::NeuralNetworkLayer::inputtensor_size
                          ((NeuralNetworkLayer *)err._M_storage._M_storage);
        if (iVar2 != iVar3) {
          psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)err._M_storage._M_storage);
          std::__cxx11::string::string((string *)local_e0,(string *)psVar7);
          std::operator+(&local_c0,"Layer \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0,&local_c0,"\'\'s input and inputTensors have different lengths");
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)local_e0);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
          err.super__Rb_tree_node_base._M_right._4_4_ = 1;
          std::__cxx11::string::~string((string *)local_a0);
          goto LAB_0038fdb5;
        }
        __range4._4_4_ = 0;
        pRVar8 = Specification::NeuralNetworkLayer::inputtensor
                           ((NeuralNetworkLayer *)err._M_storage._M_storage);
        __end0_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::begin(pRVar8);
        tensor = (Tensor *)
                 google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::end(pRVar8);
        while (bVar1 = google::protobuf::internal::
                       RepeatedPtrIterator<const_CoreML::Specification::Tensor>::operator!=
                                 (&__end0_1,(iterator *)&tensor), bVar1) {
          local_130.m_message._M_storage._M_storage =
               (uchar  [8])
               google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Tensor>
               ::operator*(&__end0_1);
          validateTensorMessage
                    (&local_130,(Tensor *)local_130.m_message._M_storage._M_storage,
                     (NeuralNetworkLayer *)err._M_storage._M_storage);
          Result::operator=((Result *)&__range1,&local_130);
          Result::~Result(&local_130);
          bVar1 = Result::good((Result *)&__range1);
          if (!bVar1) {
            Result::Result(__return_storage_ptr__,(Result *)&__range1);
            err.super__Rb_tree_node_base._M_right._4_4_ = 1;
            goto LAB_0038fdb5;
          }
          psVar7 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                             ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4._4_4_);
          err_1._M_storage._M_storage =
               (uchar  [8])
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this->ModelIOBlobNameToRank,(key_type *)psVar7);
          err_1.super__Rb_tree_node_base._M_right =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end(&this->ModelIOBlobNameToRank);
          bVar1 = std::operator==((_Self *)&err_1._M_storage,
                                  (_Self *)&err_1.super__Rb_tree_node_base._M_right);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            uVar4 = Specification::Tensor::rank((Tensor *)local_130.m_message._M_storage._M_storage)
            ;
            psVar7 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                               ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4._4_4_);
            puVar9 = (uint32 *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->ModelIOBlobNameToRank,(key_type *)psVar7);
            if (uVar4 != *puVar9) {
              psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                 ((NeuralNetworkLayer *)err._M_storage._M_storage);
              std::__cxx11::string::string((string *)&local_200,(string *)psVar7);
              std::operator+(&local_1e0,"Layer \'",&local_200);
              std::operator+(&local_1c0,&local_1e0,"\'\'s input \'");
              psVar7 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                                 ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4._4_4_);
              std::__cxx11::string::string((string *)&local_220,(string *)psVar7);
              std::operator+(&local_1a0,&local_1c0,&local_220);
              std::operator+(&local_180,&local_1a0,
                             "\' is also an input to the model. However, for this tensor the rank provided in the layer description"
                            );
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_160,&local_180,
                             " does not match the one provided in the model description");
              std::__cxx11::string::~string((string *)&local_180);
              std::__cxx11::string::~string((string *)&local_1a0);
              std::__cxx11::string::~string((string *)&local_220);
              std::__cxx11::string::~string((string *)&local_1c0);
              std::__cxx11::string::~string((string *)&local_1e0);
              std::__cxx11::string::~string((string *)&local_200);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_160);
              err.super__Rb_tree_node_base._M_right._4_4_ = 1;
              std::__cxx11::string::~string((string *)local_160);
              goto LAB_0038fdb5;
            }
          }
          psVar7 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                             ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4._4_4_);
          err_2._M_storage._M_storage =
               (uchar  [8])
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this->blobNameToRank,(key_type *)psVar7);
          err_2.super__Rb_tree_node_base._M_right =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end(&this->blobNameToRank);
          bVar1 = std::operator==((_Self *)&err_2._M_storage,
                                  (_Self *)&err_2.super__Rb_tree_node_base._M_right);
          if (bVar1) {
            uVar4 = Specification::Tensor::rank((Tensor *)local_130.m_message._M_storage._M_storage)
            ;
            psVar7 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                               ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4._4_4_);
            puVar9 = (uint32 *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->blobNameToRank,(key_type *)psVar7);
            *puVar9 = uVar4;
          }
          else {
            psVar7 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                               ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4._4_4_);
            puVar9 = (uint32 *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->blobNameToRank,(key_type *)psVar7);
            uVar4 = *puVar9;
            uVar5 = Specification::Tensor::rank((Tensor *)local_130.m_message._M_storage._M_storage)
            ;
            if (uVar4 != uVar5) {
              psVar7 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                                 ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4._4_4_);
              std::__cxx11::string::string
                        ((string *)&err_3.super__Rb_tree_node_base._M_right,(string *)psVar7);
              std::operator+(&local_270,"Inconsistent rank for the blob named \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &err_3.super__Rb_tree_node_base._M_right);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_250,&local_270,"\'.");
              std::__cxx11::string::~string((string *)&local_270);
              std::__cxx11::string::~string((string *)&err_3.super__Rb_tree_node_base._M_right);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_250);
              err.super__Rb_tree_node_base._M_right._4_4_ = 1;
              std::__cxx11::string::~string((string *)local_250);
              goto LAB_0038fdb5;
            }
          }
          __range4._4_4_ = __range4._4_4_ + 1;
          google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Tensor>::
          operator++(&__end0_1);
        }
      }
      iVar2 = Specification::NeuralNetworkLayer::outputtensor_size
                        ((NeuralNetworkLayer *)err._M_storage._M_storage);
      if (iVar2 != 0) {
        iVar2 = Specification::NeuralNetworkLayer::output_size
                          ((NeuralNetworkLayer *)err._M_storage._M_storage);
        iVar3 = Specification::NeuralNetworkLayer::outputtensor_size
                          ((NeuralNetworkLayer *)err._M_storage._M_storage);
        if (iVar2 != iVar3) {
          psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)err._M_storage._M_storage);
          std::__cxx11::string::string((string *)local_2f0,(string *)psVar7);
          std::operator+(&local_2d0,"Layer \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0,&local_2d0,
                         "\'\'s output and \"outputTensors\" property have different lengths");
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)local_2f0);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_2b0);
          err.super__Rb_tree_node_base._M_right._4_4_ = 1;
          std::__cxx11::string::~string((string *)local_2b0);
          goto LAB_0038fdb5;
        }
        __range4_1._4_4_ = 0;
        pRVar8 = Specification::NeuralNetworkLayer::outputtensor
                           ((NeuralNetworkLayer *)err._M_storage._M_storage);
        __end0_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::begin(pRVar8);
        tensor_1 = (Tensor *)
                   google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::end(pRVar8);
        while (bVar1 = google::protobuf::internal::
                       RepeatedPtrIterator<const_CoreML::Specification::Tensor>::operator!=
                                 (&__end0_2,(iterator *)&tensor_1), bVar1) {
          local_340.m_message._M_storage._M_storage =
               (uchar  [8])
               google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Tensor>
               ::operator*(&__end0_2);
          validateTensorMessage
                    (&local_340,(Tensor *)local_340.m_message._M_storage._M_storage,
                     (NeuralNetworkLayer *)err._M_storage._M_storage);
          Result::operator=((Result *)&__range1,&local_340);
          Result::~Result(&local_340);
          bVar1 = Result::good((Result *)&__range1);
          if (!bVar1) {
            Result::Result(__return_storage_ptr__,(Result *)&__range1);
            err.super__Rb_tree_node_base._M_right._4_4_ = 1;
            goto LAB_0038fdb5;
          }
          psVar7 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                             ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4_1._4_4_);
          err_4._M_storage._M_storage =
               (uchar  [8])
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this->ModelIOBlobNameToRank,(key_type *)psVar7);
          err_4.super__Rb_tree_node_base._M_right =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end(&this->ModelIOBlobNameToRank);
          bVar1 = std::operator==((_Self *)&err_4._M_storage,
                                  (_Self *)&err_4.super__Rb_tree_node_base._M_right);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            uVar4 = Specification::Tensor::rank((Tensor *)local_340.m_message._M_storage._M_storage)
            ;
            psVar7 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                               ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4_1._4_4_);
            puVar9 = (uint32 *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->ModelIOBlobNameToRank,(key_type *)psVar7);
            if (uVar4 != *puVar9) {
              psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                 ((NeuralNetworkLayer *)err._M_storage._M_storage);
              std::__cxx11::string::string((string *)&local_410,(string *)psVar7);
              std::operator+(&local_3f0,"Layer \'",&local_410);
              std::operator+(&local_3d0,&local_3f0,"\'\'s output \'");
              psVar7 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                                 ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4_1._4_4_);
              std::__cxx11::string::string((string *)&local_430,(string *)psVar7);
              std::operator+(&local_3b0,&local_3d0,&local_430);
              std::operator+(&local_390,&local_3b0,
                             "\' is also an output of the model. However, for this tensor the rank provided in the layer description"
                            );
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_370,&local_390,
                             " does not match the one provided in the model description");
              std::__cxx11::string::~string((string *)&local_390);
              std::__cxx11::string::~string((string *)&local_3b0);
              std::__cxx11::string::~string((string *)&local_430);
              std::__cxx11::string::~string((string *)&local_3d0);
              std::__cxx11::string::~string((string *)&local_3f0);
              std::__cxx11::string::~string((string *)&local_410);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_370);
              err.super__Rb_tree_node_base._M_right._4_4_ = 1;
              std::__cxx11::string::~string((string *)local_370);
              goto LAB_0038fdb5;
            }
          }
          psVar7 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                             ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4_1._4_4_);
          err_5._M_storage._M_storage =
               (uchar  [8])
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this->blobNameToRank,(key_type *)psVar7);
          err_5.super__Rb_tree_node_base._M_right =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end(&this->blobNameToRank);
          bVar1 = std::operator==((_Self *)&err_5._M_storage,
                                  (_Self *)&err_5.super__Rb_tree_node_base._M_right);
          if (bVar1) {
            uVar4 = Specification::Tensor::rank((Tensor *)local_340.m_message._M_storage._M_storage)
            ;
            psVar7 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                               ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4_1._4_4_);
            puVar9 = (uint32 *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->blobNameToRank,(key_type *)psVar7);
            *puVar9 = uVar4;
          }
          else {
            psVar7 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                               ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4_1._4_4_);
            puVar9 = (uint32 *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->blobNameToRank,(key_type *)psVar7);
            uVar4 = *puVar9;
            uVar5 = Specification::Tensor::rank((Tensor *)local_340.m_message._M_storage._M_storage)
            ;
            if (uVar4 != uVar5) {
              psVar7 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                                 ((NeuralNetworkLayer *)err._M_storage._M_storage,__range4_1._4_4_);
              std::__cxx11::string::string((string *)&local_4a0,(string *)psVar7);
              std::operator+(&local_480,"Inconsistent rank for the blob named \'",&local_4a0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_460,&local_480,"\'.");
              std::__cxx11::string::~string((string *)&local_480);
              std::__cxx11::string::~string((string *)&local_4a0);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_460);
              err.super__Rb_tree_node_base._M_right._4_4_ = 1;
              std::__cxx11::string::~string((string *)local_460);
              goto LAB_0038fdb5;
            }
          }
          __range4_1._4_4_ = __range4_1._4_4_ + 1;
          google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Tensor>::
          operator++(&__end0_2);
        }
      }
    }
    validateLayer((Result *)&__range2,this,(NeuralNetworkLayer *)err._M_storage._M_storage);
    Result::operator=((Result *)&__range1,(Result *)&__range2);
    Result::~Result((Result *)&__range2);
    bVar1 = Result::good((Result *)&__range1);
    if (!bVar1) {
      Result::Result(__return_storage_ptr__,(Result *)&__range1);
      err.super__Rb_tree_node_base._M_right._4_4_ = 1;
      goto LAB_0038fdb5;
    }
    pRVar10 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                        ((NeuralNetworkLayer *)err._M_storage._M_storage);
    __end0_3 = google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::begin(pRVar10);
    input = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::end(pRVar10);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator!=(&__end0_3,(iterator *)&input), bVar1) {
      p_Var11 = google::protobuf::internal::
                RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end0_3);
      err_6._M_storage._M_storage =
           (uchar  [8])
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find(&this->blobs,(key_type *)p_Var11);
      err_6.super__Rb_tree_node_base._M_right =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end(&this->blobs);
      bVar1 = std::operator==((_Self *)&err_6._M_storage,
                              (_Self *)&err_6.super__Rb_tree_node_base._M_right);
      if (bVar1) {
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)err._M_storage._M_storage);
        std::__cxx11::string::string((string *)&local_598,(string *)psVar7);
        std::operator+(&local_578,"Layer \'",&local_598);
        std::operator+(&local_558,&local_578,"\' consumes an input named \'");
        std::__cxx11::string::string((string *)&__range2_1,(string *)p_Var11);
        std::operator+(&local_538,&local_558,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range2_1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_518,&local_538,"\' which is not present in this network.");
        std::__cxx11::string::~string((string *)&local_538);
        std::__cxx11::string::~string((string *)&__range2_1);
        std::__cxx11::string::~string((string *)&local_558);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::string::~string((string *)&local_598);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_518);
        err.super__Rb_tree_node_base._M_right._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_518);
        goto LAB_0038fdb5;
      }
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end0_3);
    }
    pRVar10 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                        ((NeuralNetworkLayer *)err._M_storage._M_storage);
    __end0_4 = google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::begin(pRVar10);
    output = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::end(pRVar10);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator!=(&__end0_4,(iterator *)&output), bVar1) {
      p_Var11 = google::protobuf::internal::
                RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end0_4);
      layer_name._M_storage._M_storage =
           (uchar  [8])
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find(&this->blobs,(key_type *)p_Var11);
      layer_name.super__Rb_tree_node_base._M_right =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end(&this->blobs);
      bVar1 = std::operator!=((_Self *)&layer_name._M_storage,
                              (_Self *)&layer_name.super__Rb_tree_node_base._M_right);
      if ((bVar1) &&
         (LVar6 = Specification::NeuralNetworkLayer::layer_case
                            ((NeuralNetworkLayer *)err._M_storage._M_storage), LVar6 != kCopy)) {
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&this->blobs,(key_type *)p_Var11);
        err_7.super__Rb_tree_node_base._M_right =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pmVar13);
        p_Var12 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&err_7.super__Rb_tree_node_base._M_right);
        std::__cxx11::string::string((string *)&err_7._M_storage,(string *)p_Var12);
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)err._M_storage._M_storage);
        std::__cxx11::string::string((string *)&local_6f0,(string *)psVar7);
        std::operator+(&local_6d0,"Layer \'",&local_6f0);
        std::operator+(&local_6b0,&local_6d0,"\' produces an output named \'");
        std::__cxx11::string::string((string *)&local_710,(string *)p_Var11);
        std::operator+(&local_690,&local_6b0,&local_710);
        std::operator+(&local_670,&local_690,"\' which is also an output produced by the layer \'");
        std::operator+(&local_650,&local_670,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &err_7._M_storage);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_630,&local_650,"\'.");
        std::__cxx11::string::~string((string *)&local_650);
        std::__cxx11::string::~string((string *)&local_670);
        std::__cxx11::string::~string((string *)&local_690);
        std::__cxx11::string::~string((string *)&local_710);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::__cxx11::string::~string((string *)&local_6d0);
        std::__cxx11::string::~string((string *)&local_6f0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_630);
        err.super__Rb_tree_node_base._M_right._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_630);
        std::__cxx11::string::~string((string *)&err_7._M_storage);
        goto LAB_0038fdb5;
      }
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&this->blobs,(key_type *)p_Var11);
      psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)err._M_storage._M_storage);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(pmVar13,psVar7);
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end0_4);
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::NeuralNetworkLayer>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

Result NeuralNetworkSpecValidator::validateNeuralNetwork(const T& nn) {
    
    Result r;
    
    // Loop over the layers
    // For each layer, validate the following:
    // 1. inputtensor/outputtensor message, rank compatibilty with Model input/output ranks
    // 2. Check rank consistency across the network for all blobs: ranks are not allowed to change for the same blob
    // 3. Call layer specific validation function
    // 4. check that layer's inputs are already present in "availableBlobs" set
    // 5. check that layer's outputs are NOT already present in "availableBlobs" set
    // 6. Add the layer's outputs to the "availableBlobs" set
    for (const auto& layer : nn.layers()) {
        
        if (!r.good()) {
            return r;
        }
        
        // check for inputtensor message valididty
        if (ndArrayInterpretation) {
            if (layer.inputtensor_size() != 0) {
                if (layer.input_size() != layer.inputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s input and inputTensors have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.inputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.input(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.input(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s input '" + std::string(layer.input(idx)) + \
                            "' is also an input to the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.input(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.input(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.input(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.input(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
            if (layer.outputtensor_size() != 0) {
                if (layer.output_size() != layer.outputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s output and \"outputTensors\" property have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.outputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.output(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.output(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s output '" + std::string(layer.input(idx)) + \
                            "' is also an output of the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.output(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.output(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.output(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.output(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
        } // inputtensor, outputtensor validity end
        
        // First, we check the layer for internal correctness
        // this calls layer wise function
        r = validateLayer(layer);
        
        if (!r.good()) {
            return r;
        }
        
        // Check for topological defects: the layer's input must have been produced by a blob we have
        // already seen.
        for (const auto& input: layer.input()) {
            if (blobs.find(input) == blobs.end()) {
                std::string err = "Layer '" + std::string(layer.name()) + "' consumes an input named '"
                + std::string(input) + "' which is not present in this network.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
        
        // Check for topological defects: check that the same output isn't being produced in two different places.
        // unless its the "copy" layer
        for (const auto& output: layer.output()) {
            if (blobs.find(output) != blobs.end()) {
                if (layer.layer_case() != Specification::NeuralNetworkLayer::LayerCase::kCopy) {
                    std::string layer_name = *(blobs[output].begin());
                    std::string err = "Layer '" + std::string(layer.name()) + "' produces an output named '"
                    + std::string(output) + "' which is also an output produced by the layer '"
                    + layer_name + "'.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
            blobs[output].insert(layer.name());
        }
    } // loop over layers
    
    return Result();
}